

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int agginfoPersistExprCb(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Expr *pEVar4;
  char *in_RSI;
  undefined8 *in_RDI;
  sqlite3 *db;
  Parse *pParse;
  int iAgg;
  AggInfo *pAggInfo;
  Expr *in_stack_ffffffffffffffc8;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (((*(uint *)(in_RSI + 4) & 0x14000) == 0) && (*(long *)(in_RSI + 0x38) != 0)) {
    lVar1 = *(long *)(in_RSI + 0x38);
    iVar2 = (int)*(short *)(in_RSI + 0x32);
    pEVar4 = (Expr *)*in_RDI;
    pParse_00 = *(Parse **)pEVar4;
    iVar3 = (int)((ulong)pParse_00 >> 0x20);
    if (*in_RSI == -0x57) {
      if ((((iVar2 < *(int *)(lVar1 + 0x30)) &&
           (*(char **)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 0x20) == in_RSI)) &&
          (pEVar4 = sqlite3ExprDup((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),pEVar4,iVar3
                                  ), pEVar4 != (Expr *)0x0)) &&
         (iVar3 = sqlite3ExprDeferredDelete(pParse_00,in_stack_ffffffffffffffc8), iVar3 == 0)) {
        *(Expr **)(*(long *)(lVar1 + 0x28) + (long)iVar2 * 0x20) = pEVar4;
      }
    }
    else if (((iVar2 < *(int *)(lVar1 + 0x20)) &&
             (*(char **)(*(long *)(lVar1 + 0x18) + (long)iVar2 * 0x18 + 8) == in_RSI)) &&
            ((pEVar4 = sqlite3ExprDup((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),pEVar4,
                                      iVar3), pEVar4 != (Expr *)0x0 &&
             (iVar3 = sqlite3ExprDeferredDelete(pParse_00,in_stack_ffffffffffffffc8), iVar3 == 0))))
    {
      *(Expr **)(*(long *)(lVar1 + 0x18) + (long)iVar2 * 0x18 + 8) = pEVar4;
    }
  }
  return 0;
}

Assistant:

static int agginfoPersistExprCb(Walker *pWalker, Expr *pExpr){
  if( ALWAYS(!ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced))
   && pExpr->pAggInfo!=0
  ){
    AggInfo *pAggInfo = pExpr->pAggInfo;
    int iAgg = pExpr->iAgg;
    Parse *pParse = pWalker->pParse;
    sqlite3 *db = pParse->db;
    assert( iAgg>=0 );
    if( pExpr->op!=TK_AGG_FUNCTION ){
      if( iAgg<pAggInfo->nColumn
       && pAggInfo->aCol[iAgg].pCExpr==pExpr
      ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr && !sqlite3ExprDeferredDelete(pParse, pExpr) ){
          pAggInfo->aCol[iAgg].pCExpr = pExpr;
        }
      }
    }else{
      assert( pExpr->op==TK_AGG_FUNCTION );
      if( ALWAYS(iAgg<pAggInfo->nFunc)
       && pAggInfo->aFunc[iAgg].pFExpr==pExpr
      ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr && !sqlite3ExprDeferredDelete(pParse, pExpr) ){
          pAggInfo->aFunc[iAgg].pFExpr = pExpr;
        }
      }
    }
  }
  return WRC_Continue;
}